

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O3

void __thiscall
hta::storage::file::Metric::Metric<hta::storage::file::FileOpenTag::Write>
          (Metric *this,path *param_2)

{
  _Rb_tree_header *p_Var1;
  undefined8 in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  path local_70;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 local_20 [16];
  
  (this->super_Metric)._vptr_Metric = (_func_int **)&PTR_meta_001b4c38;
  this->open_mode_ = write;
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&this->path_,param_2);
  path_raw_abi_cxx11_(&local_70,this);
  local_48 = 2;
  local_40 = 0;
  local_38 = 1;
  local_30 = 1000000000;
  local_28 = in_stack_00000008;
  local_20._0_8_ = in_stack_00000010._8_8_;
  local_20._8_4_ = in_stack_00000010._0_4_;
  local_20._12_4_ = in_stack_00000010._4_4_;
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File(&this->file_raw_,&local_70);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&local_70);
  p_Var1 = &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Metric(FOT file_open_tag, const std::filesystem::path& path, Meta meta)
    : open_mode_(file_open_tag.mode), path_(path),
      file_raw_(file_open_tag, path_raw(), Header(Duration(0), meta))
    {
    }